

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O1

KDataStream * __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::Encode
          (KDataStream *__return_storage_ptr__,LE_DeadReckoningParameter *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  KDataStream::Write(__return_storage_ptr__,this->m_ui8DeadRecknoningAlgorithm);
  (*(this->m_LinearAcceleration).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_LinearAcceleration,__return_storage_ptr__);
  (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AngularVelocity,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream LE_DeadReckoningParameter::Encode() const
{
    KDataStream stream;

    LE_DeadReckoningParameter::Encode( stream );

    return stream;
}